

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogFinish(void)

{
  _func_void_char_ptr *p_Var1;
  ImGuiContext *pIVar2;
  int iVar3;
  char *pcVar4;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if ((GImGui->LogEnabled & 1U) != 0) {
    LogText("\n");
    pIVar2->LogEnabled = false;
    if (pIVar2->LogFile != (FILE *)0x0) {
      if (pIVar2->LogFile == _stdout) {
        fflush((FILE *)pIVar2->LogFile);
      }
      else {
        fclose((FILE *)pIVar2->LogFile);
      }
      pIVar2->LogFile = (FILE *)0x0;
    }
    iVar3 = ImGuiTextBuffer::size(pIVar2->LogClipboard);
    if (1 < iVar3) {
      if ((pIVar2->IO).SetClipboardTextFn != (_func_void_char_ptr *)0x0) {
        p_Var1 = (pIVar2->IO).SetClipboardTextFn;
        pcVar4 = ImGuiTextBuffer::begin(pIVar2->LogClipboard);
        (*p_Var1)(pcVar4);
      }
      ImGuiTextBuffer::clear(pIVar2->LogClipboard);
    }
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    g.LogEnabled = false;
    if (g.LogFile != NULL)
    {
        if (g.LogFile == stdout)
            fflush(g.LogFile);
        else
            fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard->size() > 1)
    {
        if (g.IO.SetClipboardTextFn)
            g.IO.SetClipboardTextFn(g.LogClipboard->begin());
        g.LogClipboard->clear();
    }
}